

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentSSBOAtomicCounterMixedCase::
ConcurrentSSBOAtomicCounterMixedCase
          (ConcurrentSSBOAtomicCounterMixedCase *this,Context *context,char *name,char *description,
          int numCalls,int workSize)

{
  int workSize_local;
  int numCalls_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ConcurrentSSBOAtomicCounterMixedCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ConcurrentSSBOAtomicCounterMixedCase_032b4238;
  this->m_numCalls = numCalls;
  this->m_workSize = workSize;
  this->m_bufferID = 0;
  this->m_ssboAtomicProgram = (ShaderProgram *)0x0;
  this->m_atomicCounterProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

ConcurrentSSBOAtomicCounterMixedCase::ConcurrentSSBOAtomicCounterMixedCase (Context& context, const char* name, const char* description, int numCalls, int workSize)
	: TestCase					(context, name, description)
	, m_numCalls				(numCalls)
	, m_workSize				(workSize)
	, m_bufferID				(DE_NULL)
	, m_ssboAtomicProgram		(DE_NULL)
	, m_atomicCounterProgram	(DE_NULL)
{
	// SSBO atomic XORs cancel out
	DE_ASSERT((workSize * numCalls) % (16 * 2) == 0);
}